

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenGlobalRef
BinaryenAddGlobal(BinaryenModuleRef module,char *name,BinaryenType type,bool mutable_,
                 BinaryenExpressionRef init)

{
  Global *this;
  Type local_60;
  string_view local_58 [2];
  Global *local_38;
  Global *ret;
  BinaryenExpressionRef init_local;
  BinaryenType BStack_20;
  bool mutable__local;
  BinaryenType type_local;
  char *name_local;
  BinaryenModuleRef module_local;
  
  ret = (Global *)init;
  init_local._7_1_ = mutable_;
  BStack_20 = type;
  type_local = (BinaryenType)name;
  name_local = (char *)module;
  this = (Global *)operator_new(0x50);
  this->init = (Expression *)0x0;
  *(undefined8 *)&this->mutable_ = 0;
  (this->super_Importable).base.super_IString.str._M_str = (char *)0x0;
  (this->type).id = 0;
  (this->super_Importable).module.super_IString.str._M_str = (char *)0x0;
  (this->super_Importable).base.super_IString.str._M_len = 0;
  *(undefined8 *)&(this->super_Importable).super_Named.hasExplicitName = 0;
  (this->super_Importable).module.super_IString.str._M_len = 0;
  (this->super_Importable).super_Named.name.super_IString.str._M_len = 0;
  (this->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
  wasm::Global::Global(this);
  local_38 = this;
  wasm::Name::Name((Name *)local_58,(char *)type_local);
  wasm::Named::setExplicitName((Named *)this,(Name)local_58[0]);
  wasm::Type::Type(&local_60,BStack_20);
  (local_38->type).id = local_60.id;
  local_38->mutable_ = (bool)(init_local._7_1_ & 1);
  local_38->init = (Expression *)ret;
  wasm::Module::addGlobal((Module *)name_local,local_38);
  return local_38;
}

Assistant:

BinaryenGlobalRef BinaryenAddGlobal(BinaryenModuleRef module,
                                    const char* name,
                                    BinaryenType type,
                                    bool mutable_,
                                    BinaryenExpressionRef init) {
  auto* ret = new Global();
  ret->setExplicitName(name);
  ret->type = Type(type);
  ret->mutable_ = mutable_;
  ret->init = (Expression*)init;
  ((Module*)module)->addGlobal(ret);
  return ret;
}